

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinePropertyCommand.h
# Opt level: O0

void __thiscall cmDefinePropertyCommand::~cmDefinePropertyCommand(cmDefinePropertyCommand *this)

{
  cmDefinePropertyCommand *this_local;
  
  ~cmDefinePropertyCommand(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

cmCommand* Clone() override { return new cmDefinePropertyCommand; }